

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# World.cpp
# Opt level: O0

aphy_error __thiscall
APhyBullet::BulletWorld::removeCharacterController
          (BulletWorld *this,character_controller_ref *character)

{
  bool bVar1;
  BulletCharacterController *pBVar2;
  ref *in_RSI;
  unordered_set<aphy::ref<aphy::character_controller>,_std::hash<aphy::ref<aphy::character_controller>_>,_std::equal_to<aphy::ref<aphy::character_controller>_>,_std::allocator<aphy::ref<aphy::character_controller>_>_>
  *in_RDI;
  iterator it;
  unordered_set<aphy::ref<aphy::character_controller>,_std::hash<aphy::ref<aphy::character_controller>_>,_std::equal_to<aphy::ref<aphy::character_controller>_>,_std::allocator<aphy::ref<aphy::character_controller>_>_>
  *this_00;
  _Node_iterator_base<aphy::ref<aphy::character_controller>,_true> in_stack_ffffffffffffffc8;
  _Node_iterator_base<aphy::ref<aphy::character_controller>,_true> local_28;
  _Node_iterator_base<aphy::ref<aphy::character_controller>,_true> local_20;
  ref *local_18;
  aphy_error local_4;
  
  local_18 = in_RSI;
  bVar1 = aphy::ref::operator_cast_to_bool(in_RSI);
  if (bVar1) {
    this_00 = (unordered_set<aphy::ref<aphy::character_controller>,_std::hash<aphy::ref<aphy::character_controller>_>,_std::equal_to<aphy::ref<aphy::character_controller>_>,_std::allocator<aphy::ref<aphy::character_controller>_>_>
               *)(in_RDI->_M_h)._M_before_begin._M_nxt;
    pBVar2 = aphy::ref<aphy::character_controller>::as<APhyBullet::BulletCharacterController>
                       ((ref<aphy::character_controller> *)local_18);
    (*(code *)(this_00->_M_h)._M_buckets[0x11])(this_00,pBVar2->handle);
    local_20._M_cur =
         (__node_type *)
         std::
         unordered_set<aphy::ref<aphy::character_controller>,_std::hash<aphy::ref<aphy::character_controller>_>,_std::equal_to<aphy::ref<aphy::character_controller>_>,_std::allocator<aphy::ref<aphy::character_controller>_>_>
         ::find(this_00,(key_type *)0x13624e);
    local_28._M_cur =
         (__node_type *)
         std::
         unordered_set<aphy::ref<aphy::character_controller>,_std::hash<aphy::ref<aphy::character_controller>_>,_std::equal_to<aphy::ref<aphy::character_controller>_>,_std::allocator<aphy::ref<aphy::character_controller>_>_>
         ::end(this_00);
    bVar1 = std::__detail::operator!=(&local_20,&local_28);
    if (bVar1) {
      std::
      unordered_set<aphy::ref<aphy::character_controller>,_std::hash<aphy::ref<aphy::character_controller>_>,_std::equal_to<aphy::ref<aphy::character_controller>_>,_std::allocator<aphy::ref<aphy::character_controller>_>_>
      ::erase(in_RDI,(iterator)in_stack_ffffffffffffffc8._M_cur);
    }
    local_4 = APHY_OK;
  }
  else {
    local_4 = APHY_NULL_POINTER;
  }
  return local_4;
}

Assistant:

aphy_error BulletWorld::removeCharacterController(const character_controller_ref &character)
{
    CHECK_POINTER(character);

    handle->removeAction(character.as<BulletCharacterController>()->handle);
    auto it = characterControllers.find(character);
    if(it != characterControllers.end())
        characterControllers.erase(it);
    return APHY_OK;
}